

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O0

int nodeVPush(xmlValidCtxtPtr ctxt,xmlNodePtr value)

{
  int iVar1;
  xmlNodePtr *ppxVar2;
  xmlNodePtr *tmp;
  xmlNodePtr value_local;
  xmlValidCtxtPtr ctxt_local;
  
  if (ctxt->nodeMax < 1) {
    ctxt->nodeMax = 4;
    ppxVar2 = (xmlNodePtr *)(*xmlMalloc)((long)ctxt->nodeMax << 3);
    ctxt->nodeTab = ppxVar2;
    if (ctxt->nodeTab == (xmlNodePtr *)0x0) {
      xmlVErrMemory(ctxt,"malloc failed");
      ctxt->nodeMax = 0;
      return 0;
    }
  }
  if (ctxt->nodeMax <= ctxt->nodeNr) {
    ppxVar2 = (xmlNodePtr *)(*xmlRealloc)(ctxt->nodeTab,(long)(ctxt->nodeMax << 1) << 3);
    if (ppxVar2 == (xmlNodePtr *)0x0) {
      xmlVErrMemory(ctxt,"realloc failed");
      return 0;
    }
    ctxt->nodeMax = ctxt->nodeMax << 1;
    ctxt->nodeTab = ppxVar2;
  }
  ctxt->nodeTab[ctxt->nodeNr] = value;
  ctxt->node = value;
  iVar1 = ctxt->nodeNr;
  ctxt->nodeNr = iVar1 + 1;
  return iVar1;
}

Assistant:

static int
nodeVPush(xmlValidCtxtPtr ctxt, xmlNodePtr value)
{
    if (ctxt->nodeMax <= 0) {
        ctxt->nodeMax = 4;
        ctxt->nodeTab =
            (xmlNodePtr *) xmlMalloc(ctxt->nodeMax *
                                     sizeof(ctxt->nodeTab[0]));
        if (ctxt->nodeTab == NULL) {
	    xmlVErrMemory(ctxt, "malloc failed");
            ctxt->nodeMax = 0;
            return (0);
        }
    }
    if (ctxt->nodeNr >= ctxt->nodeMax) {
        xmlNodePtr *tmp;
        tmp = (xmlNodePtr *) xmlRealloc(ctxt->nodeTab,
			      ctxt->nodeMax * 2 * sizeof(ctxt->nodeTab[0]));
        if (tmp == NULL) {
	    xmlVErrMemory(ctxt, "realloc failed");
            return (0);
        }
        ctxt->nodeMax *= 2;
	ctxt->nodeTab = tmp;
    }
    ctxt->nodeTab[ctxt->nodeNr] = value;
    ctxt->node = value;
    return (ctxt->nodeNr++);
}